

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O0

void brotli::RecomputeDistancePrefixes
               (Command *cmds,size_t num_commands,uint32_t num_direct_distance_codes,
               uint32_t distance_postfix_bits)

{
  uint32_t uVar1;
  Command *this;
  Command *cmd;
  size_t i;
  uint32_t distance_postfix_bits_local;
  uint32_t num_direct_distance_codes_local;
  size_t num_commands_local;
  Command *cmds_local;
  
  if ((num_direct_distance_codes != 0) || (distance_postfix_bits != 0)) {
    for (cmd = (Command *)0x0; cmd < num_commands; cmd = (Command *)((long)&cmd->insert_len_ + 1)) {
      this = cmds + (long)cmd;
      if ((this->copy_len_ != 0) && (0x7f < this->cmd_prefix_)) {
        uVar1 = Command::DistanceCode(this);
        PrefixEncodeCopyDistance
                  ((ulong)uVar1,(ulong)num_direct_distance_codes,(ulong)distance_postfix_bits,
                   &this->dist_prefix_,&this->dist_extra_);
      }
    }
  }
  return;
}

Assistant:

void RecomputeDistancePrefixes(Command* cmds,
                               size_t num_commands,
                               uint32_t num_direct_distance_codes,
                               uint32_t distance_postfix_bits) {
  if (num_direct_distance_codes == 0 && distance_postfix_bits == 0) {
    return;
  }
  for (size_t i = 0; i < num_commands; ++i) {
    Command* cmd = &cmds[i];
    if (cmd->copy_len_ > 0 && cmd->cmd_prefix_ >= 128) {
      PrefixEncodeCopyDistance(cmd->DistanceCode(),
                               num_direct_distance_codes,
                               distance_postfix_bits,
                               &cmd->dist_prefix_,
                               &cmd->dist_extra_);
    }
  }
}